

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnp.cpp
# Opt level: O2

double calcErrAlgebraicRnPFocalRadialSingleLin
                 (Vector3d *vr,Vector3d *Cr,Vector3d *wr,Vector3d *tr,double f,double rd,double r0,
                 MatrixXd *X,MatrixXd *u,int direction)

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  DenseBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_0>_>
  *pDVar5;
  Matrix3d *pMVar6;
  int i;
  long lVar7;
  byte bVar8;
  double dVar9;
  RealScalar RVar10;
  Vector3d local_468;
  Vector3d local_448;
  Vector3d eq;
  Vector3d uh;
  Vector3d *local_3f0;
  Matrix3d *local_3e8;
  RealScalar RStack_3e0;
  double local_3d0;
  undefined1 *local_3c8;
  Matrix3d *local_3b0;
  double *local_3a8;
  long local_3a0;
  MatrixXd *local_390;
  undefined8 local_388;
  long local_380;
  long local_378;
  Vector3d *local_370;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_360 [16];
  double local_350;
  Vector3d *local_348;
  Matrix3d I;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  double local_2b0;
  double *local_2a8;
  undefined8 *local_2a0;
  undefined1 local_298 [16];
  LhsNested local_288;
  long local_280;
  long local_278;
  undefined1 local_1d0 [24];
  RealScalar local_1b8;
  undefined1 local_108 [72];
  Matrix3d Rv;
  undefined1 local_78 [72];
  
  bVar8 = 0;
  dVar9 = 0.0;
  lVar7 = 0;
  while( true ) {
    if ((X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols <=
        lVar7) break;
    local_2a0 = (undefined8 *)
                (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                m_rows;
    local_2a8 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                m_data + (long)local_2a0 * lVar7;
    local_288 = (LhsNested)0x0;
    local_298._8_8_ = u;
    local_280 = lVar7;
    local_278 = (long)local_2a0;
    Eigen::CommaInitializer<Eigen::Matrix<double,3,1,0,3,1>>::
    CommaInitializer<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
              ((CommaInitializer<Eigen::Matrix<double,3,1,0,3,1>> *)local_1d0,&uh,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
               &local_2a8);
    pdVar2 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
    lVar3 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows *
            lVar7;
    if ((LhsNested)local_1d0._16_8_ == (LhsNested)0x1) {
      lVar4 = 0;
      RVar10 = local_1b8;
    }
    else {
      lVar4 = local_1d0._16_8_ * 0x18;
      RVar10 = 0.0;
    }
    *(double *)(lVar4 + local_1d0._0_8_ + local_1d0._8_8_ * 8 + (long)RVar10 * 8) =
         (pdVar2[lVar3] * pdVar2[lVar3] + pdVar2[lVar3 + 1] * pdVar2[lVar3 + 1]) * rd + 1.0;
    local_2f0 = 0x3ff0000000000000;
    local_2d8 = 0;
    local_2e8 = 0;
    uStack_2e0 = 0;
    local_2d0 = 0x3ff0000000000000;
    local_2c8 = 0;
    uStack_2c0 = 0;
    local_2b8 = 0;
    I.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
    I.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
    I.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
    I.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
    I.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 1.0;
    I.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
    I.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
    I.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 0.0;
    I.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 1.0;
    dVar1 = pdVar2[lVar3 + direction];
    local_2b0 = 1.0 / f;
    RVar10 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                       ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)vr);
    if (1e-15 <= RVar10) {
      local_3f0 = vr;
      RStack_3e0 = RVar10;
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
      _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_1d0,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                  *)&local_3f0);
      local_1b8 = RVar10;
    }
    else {
      local_3f0 = (Vector3d *)0x3ff0000000000000;
      local_3e8 = (Matrix3d *)0x0;
      RStack_3e0 = 0.0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
      _set_noalias<Eigen::Matrix<double,3,1,0,3,1>>
                ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_1d0,
                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_3f0);
      local_1b8 = 0.0;
    }
    Eigen::AngleAxis<double>::toRotationMatrix((Matrix3 *)&local_2a8,(AngleAxis<double> *)local_1d0)
    ;
    pDVar5 = (DenseBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_0>_>
              *)&local_2a8;
    pMVar6 = &Rv;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
      [0] = *(double *)pDVar5;
      pDVar5 = pDVar5 + (ulong)bVar8 * -0x10 + 8;
      pMVar6 = (Matrix3d *)((long)pMVar6 + ((ulong)bVar8 * -2 + 1) * 8);
    }
    local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = uh.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
    ;
    local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = uh.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
    ;
    local_448.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = uh.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
    ;
    X_(&local_448);
    local_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = (wr->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
           [0];
    local_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = (wr->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
           [1];
    local_468.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = (wr->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
           [2];
    X_(&local_468);
    local_3a0 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                m_rows;
    local_3a8 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                m_data + local_3a0 * lVar7;
    local_3e8 = &I;
    local_388 = 0;
    local_3d0 = dVar1 - r0;
    local_3c8 = local_78;
    local_3b0 = &Rv;
    local_390 = X;
    local_380 = lVar7;
    local_378 = local_3a0;
    local_370 = Cr;
    local_350 = dVar1 - r0;
    local_348 = tr;
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
    ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 *)local_1d0,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                 *)&local_3f0,local_360);
    local_2a8 = (double *)local_108;
    local_2a0 = &local_2f0;
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     *)local_298,
                    (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     *)local_1d0);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Product<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>const>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&eq,
               (DenseBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_0>_>
                *)&local_2a8);
    dVar9 = dVar9 + ABS(eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[2]) +
                    ABS(eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[1]) +
                    ABS(eq.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[0]);
    lVar7 = lVar7 + 1;
  }
  return dVar9;
}

Assistant:

double calcErrAlgebraicRnPFocalRadialSingleLin(Eigen::Vector3d vr, Eigen::Vector3d Cr, Eigen::Vector3d wr, Eigen::Vector3d tr, double f, double rd, double r0, Eigen::MatrixXd X, Eigen::MatrixXd u, int direction){
    double err = 0;
    for (int i = 0; i < X.cols(); i++)
    {
        Eigen::Vector3d uh; 
        uh << u.col(i), 1 + rd*(u(0,i)*u(0,i) + u(1,i)*u(1,i));
        Eigen::Matrix3d K = Eigen::Matrix3d::Identity();
        K(2,2) = 1/f;
        Eigen::Matrix3d I = Eigen::Matrix3d::Identity();
        double rs = (u(direction,i)-r0);
        Eigen::Matrix3d Rv;
        double n = vr.norm();
        if(n < 1e-15){
            Rv = Eigen::AngleAxis<double>(0, (Eigen::Vector3d() << 1,0,0).finished()).toRotationMatrix();
        }else{
            Rv = Eigen::AngleAxis<double>(n, vr/n).toRotationMatrix();
        }
        
        Eigen::Vector3d eq = X_(uh)*K*((I + rs*X_(wr))*Rv*X.col(i) + Cr + rs*tr);
        err += eq.cwiseAbs().sum();
    }
    return err;
}